

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O3

_Bool trans_INCDECP_z(DisasContext_conflict1 *s,arg_incdec2_pred *a)

{
  int iVar1;
  int iVar2;
  TCGContext_conflict1 *s_00;
  _Bool _Var3;
  TCGTemp *pTVar4;
  code *pcVar5;
  
  iVar1 = a->esz;
  if (iVar1 != 0) {
    s_00 = s->uc->tcg_ctx;
    _Var3 = sve_access_check_aarch64(s);
    if (_Var3) {
      iVar2 = s->sve_len;
      pTVar4 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      if (a->d == 0) {
        pcVar5 = tcg_gen_gvec_adds_aarch64;
      }
      else {
        pcVar5 = tcg_gen_gvec_subs_aarch64;
      }
      do_cntp((DisasContext_conflict1 *)(ulong)(uint)s->sve_len,(TCGv_i64)s->uc->tcg_ctx,
              (int)((long)pTVar4 - (long)s_00),a->esz,a->pg);
      (*pcVar5)(s_00,a->esz,a->rd * 0x100 + 0xc10,a->rn * 0x100 + 0xc10,(long)pTVar4 - (long)s_00,
                iVar2,iVar2);
    }
  }
  return iVar1 != 0;
}

Assistant:

static bool trans_INCDECP_z(DisasContext *s, arg_incdec2_pred *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (a->esz == 0) {
        return false;
    }
    if (sve_access_check(s)) {
        unsigned vsz = vec_full_reg_size(s);
        TCGv_i64 val = tcg_temp_new_i64(tcg_ctx);
        GVecGen2sFn *gvec_fn = a->d ? tcg_gen_gvec_subs : tcg_gen_gvec_adds;

        do_cntp(s, val, a->esz, a->pg, a->pg);
        gvec_fn(tcg_ctx, a->esz, vec_full_reg_offset(s, a->rd),
                vec_full_reg_offset(s, a->rn), val, vsz, vsz);
    }
    return true;
}